

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O3

int __thiscall
bdConnection::AuthoriseProxyConnection
          (bdConnection *this,bdId *param_1,bdId *param_2,bdId *param_3,int param_4,int param_5,
          int bandwidth)

{
  time_t tVar1;
  
  this->mState = 2;
  tVar1 = time((time_t *)0x0);
  this->mLastEvent = tVar1;
  this->mBandwidth = bandwidth;
  bdsockaddr_clear(&(this->mProxyId).addr);
  bdsockaddr_clear(&(this->mDestConnAddr).addr);
  return 1;
}

Assistant:

int bdConnection::AuthoriseProxyConnection(bdId */*srcId*/, bdId */*proxyId*/, bdId */*destId*/, int /*mode*/, int /*loc*/, int bandwidth) {
	mState = BITDHT_CONNECTION_WAITING_REPLY;
	mLastEvent = time(NULL);

	//mSrcId, (peer) (ID/IP known)
	//mDestId (other peer) (ID/IP known)
	//mProxyId (self) (IP unknown)

	// mPoint, mMode should be okay.

	mBandwidth = bandwidth;
	//mMaxDelay  Already set.
	//mConnectionStartTS Already Set
#ifdef DEBUG_CONNECTION_DELAY
	std::cerr << "bdConnection::AuthoriseProxyConnection(): received Bandwidth Limitation: " << mBandwidth;
	std::cerr << std::endl;
#endif
	// mSrcConnAddr (ID/IP known)
	// mDestConnAddr is still pending.

	/* clear IP Addresses to enforce this */
	bdsockaddr_clear(&(mProxyId.addr)); 
	bdsockaddr_clear(&(mDestConnAddr.addr)); 

	/* don't bother with START/ACK parameters */
	
	return 1;
}